

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::throw_or_mimic<cxxopts::option_requires_argument_exception>(string *text)

{
  undefined8 uVar1;
  string *in_stack_00000078;
  option_requires_argument_exception *in_stack_00000080;
  
  uVar1 = __cxa_allocate_exception(0x28);
  option_requires_argument_exception::option_requires_argument_exception
            (in_stack_00000080,in_stack_00000078);
  __cxa_throw(uVar1,&option_requires_argument_exception::typeinfo,
              option_requires_argument_exception::~option_requires_argument_exception);
}

Assistant:

void throw_or_mimic(const std::string& text)
  {
    static_assert(std::is_base_of<std::exception, T>::value,
                  "throw_or_mimic only works on std::exception and "
                  "deriving classes");

#ifndef CXXOPTS_NO_EXCEPTIONS
    // If CXXOPTS_NO_EXCEPTIONS is not defined, just throw
    throw T{text};
#else
    // Otherwise manually instantiate the exception, print what() to stderr,
    // and exit
    T exception{text};
    std::cerr << exception.what() << std::endl;
    std::exit(EXIT_FAILURE);
#endif
  }